

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O0

void __thiscall
UDUNITS_derivedNameSymbols_Test::~UDUNITS_derivedNameSymbols_Test
          (UDUNITS_derivedNameSymbols_Test *this)

{
  UDUNITS_derivedNameSymbols_Test *this_local;
  
  ~UDUNITS_derivedNameSymbols_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UDUNITS, derivedNameSymbols)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-derived.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert = 0;
    while (cs != nullptr) {
        auto defEl = cs->FirstChildElement("def");
        // the only one without a definition is the radian since it is
        // dimensionless according to the xml
        std::string def =
            (defEl) ? defEl->FirstChild()->Value() : std::string("rad");

        auto definitionUnit = units::unit_from_string(def);
        if (is_error(definitionUnit)) {
            std::cout << "unable to convert " << def
                      << " into a valid definition unit \n";
            ++failConvert;
        } else {
            auto name = cs->FirstChildElement("name");
            if (name != nullptr) {
                auto sname =
                    name->FirstChildElement("singular")->FirstChild()->Value();
                auto nameUnit = units::unit_from_string(sname);
                if (is_error(nameUnit)) {
                    std::cout << "unable to convert " << sname
                              << " into a valid unit def=" << def << '\n';
                    ++failConvert;
                } else {
                    if (unit_cast(nameUnit) != unit_cast(definitionUnit)) {
                        std::cout << "name and unit do not match " << sname
                                  << " and " << def << "\n";
                        ++failConvert;
                    }
                }
            }
            // check for symbols
            auto sym = cs->FirstChildElement("symbol");
            while (sym != nullptr) {
                auto symString = sym->FirstChild()->Value();
                auto symUnit = units::unit_from_string(symString);
                if (is_error(symUnit)) {
                    std::cout << "unable to convert " << symString
                              << " into a valid unit def=" << def << '\n';
                    ++failConvert;
                } else {
                    if (unit_cast(symUnit) != unit_cast(definitionUnit)) {
                        std::cout << "symbol and unit do not match "
                                  << symString << " and " << def << "\n";
                        ++failConvert;
                    }
                }
                sym = sym->NextSiblingElement("symbol");
            }
        }
        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}